

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddSetop.c
# Opt level: O2

DdNode * Cudd_zddIntersect(DdManager *dd,DdNode *P,DdNode *Q)

{
  DdNode *pDVar1;
  
  do {
    dd->reordered = 0;
    pDVar1 = cuddZddIntersect(dd,P,Q);
  } while (dd->reordered == 1);
  return pDVar1;
}

Assistant:

DdNode *
Cudd_zddIntersect(
  DdManager * dd,
  DdNode * P,
  DdNode * Q)
{
    DdNode *res;

    do {
        dd->reordered = 0;
        res = cuddZddIntersect(dd, P, Q);
    } while (dd->reordered == 1);
    return(res);

}